

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetMessage(TgTypeParser *this,ptree *data)

{
  type_conflict tVar1;
  int iVar2;
  type_conflict4 tVar3;
  type tVar4;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar5;
  allocator local_71;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  type local_40;
  
  std::make_shared<TgBot::Message>();
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"message_id",0x2e);
  iVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(in_RDX,&local_70);
  **(int **)this = iVar2;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"from",&local_71);
  tryParseJson<TgBot::User>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::User>)data,
             (ptree *)parseJsonAndGetUser,(string *)0x0);
  std::__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 8),
             (__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"date",0x2e);
  iVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(in_RDX,&local_70);
  *(int *)(*(long *)this + 0x18) = iVar2;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"chat",&local_71);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::find(in_RDX,&local_70.m_value);
  parseJsonAndGetChat((TgTypeParser *)&local_40,data);
  std::__shared_ptr<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x20),
             (__shared_ptr<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"forward_from",&local_71);
  tryParseJson<TgBot::User>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::User>)data,
             (ptree *)parseJsonAndGetUser,(string *)0x0);
  std::__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x30),
             (__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"forward_from_chat",&local_71);
  tryParseJson<TgBot::Chat>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::Chat>)data,
             (ptree *)parseJsonAndGetChat,(string *)0x0);
  std::__shared_ptr<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x40),
             (__shared_ptr<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"forward_from_message_id",0x2e);
  local_40._M_dataplus._M_p._0_4_ = 0;
  tVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(in_RDX,&local_70,(int *)&local_40);
  *(type_conflict4 *)(*(long *)this + 0x50) = tVar3;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"forward_signature",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_40,in_RDX,&local_70,"");
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x58),(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"forward_date",0x2e);
  local_40._M_dataplus._M_p._0_4_ = 0;
  tVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(in_RDX,&local_70,(int *)&local_40);
  *(type_conflict4 *)(*(long *)this + 0x78) = tVar3;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"reply_to_message",&local_71);
  tryParseJson<TgBot::Message>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::Message>)data,
             (ptree *)parseJsonAndGetMessage,(string *)0x0);
  std::__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x80),
             (__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"edit_date",0x2e);
  local_40._M_dataplus._M_p = (pointer)((ulong)local_40._M_dataplus._M_p._4_4_ << 0x20);
  tVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(in_RDX,&local_70,(int *)&local_40);
  *(type_conflict4 *)(*(long *)this + 0x90) = tVar3;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"author_signature",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_40,in_RDX,&local_70,"");
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x98),(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"text",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_40,in_RDX,&local_70,"");
  std::__cxx11::string::operator=((string *)(*(long *)this + 0xb8),(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"entities",&local_71);
  parseJsonAndGetArray<TgBot::MessageEntity>
            ((vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
              *)&local_40,(TgTypeParser *)data,0x1e3632,(ptree *)0x0,&in_RDX->m_data);
  std::
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ::_M_move_assign((vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
                    *)(*(long *)this + 0xd8),&local_40);
  std::
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ::~vector((vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
             *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"caption_entities",&local_71);
  parseJsonAndGetArray<TgBot::MessageEntity>
            ((vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
              *)&local_40,(TgTypeParser *)data,0x1e3632,(ptree *)0x0,&in_RDX->m_data);
  std::
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ::_M_move_assign((vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
                    *)(*(long *)this + 0xf0),&local_40);
  std::
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ::~vector((vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
             *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"audio",&local_71);
  tryParseJson<TgBot::Audio>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::Audio>)data,
             (ptree *)parseJsonAndGetAudio,(string *)0x0);
  std::__shared_ptr<TgBot::Audio,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Audio,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x108),
             (__shared_ptr<TgBot::Audio,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"document",&local_71);
  tryParseJson<TgBot::Document>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::Document>)data,
             (ptree *)parseJsonAndGetDocument,(string *)0x0);
  std::__shared_ptr<TgBot::Document,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Document,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x118),
             (__shared_ptr<TgBot::Document,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"animation",&local_71);
  tryParseJson<TgBot::Animation>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::Animation>)data,
             (ptree *)parseJsonAndGetAnimation,(string *)0x0);
  std::__shared_ptr<TgBot::Animation,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Animation,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x128),
             (__shared_ptr<TgBot::Animation,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"game",&local_71);
  tryParseJson<TgBot::Game>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::Game>)data,
             (ptree *)parseJsonAndGetGame,(string *)0x0);
  std::__shared_ptr<TgBot::Game,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Game,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x138),
             (__shared_ptr<TgBot::Game,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"photo",&local_71);
  parseJsonAndGetArray<TgBot::PhotoSize>
            ((vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
              *)&local_40,(TgTypeParser *)data,0x1e42d0,(ptree *)0x0,&in_RDX->m_data);
  std::
  vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>::
  _M_move_assign((vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
                  *)(*(long *)this + 0x148),&local_40);
  std::
  vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>::
  ~vector((vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
           *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"sticker",&local_71);
  tryParseJson<TgBot::Sticker>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::Sticker>)data,
             (ptree *)parseJsonAndGetSticker,(string *)0x0);
  std::__shared_ptr<TgBot::Sticker,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Sticker,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x160),
             (__shared_ptr<TgBot::Sticker,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"video",&local_71);
  tryParseJson<TgBot::Video>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::Video>)data,
             (ptree *)parseJsonAndGetVideo,(string *)0x0);
  std::__shared_ptr<TgBot::Video,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Video,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x170),
             (__shared_ptr<TgBot::Video,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"contact",&local_71);
  tryParseJson<TgBot::Contact>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::Contact>)data,
             (ptree *)parseJsonAndGetContact,(string *)0x0);
  std::__shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x1b0),
             (__shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"location",&local_71);
  tryParseJson<TgBot::Location>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::Location>)data,
             (ptree *)parseJsonAndGetLocation,(string *)0x0);
  std::__shared_ptr<TgBot::Location,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Location,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x1c0),
             (__shared_ptr<TgBot::Location,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"new_chat_participant",&local_71);
  tryParseJson<TgBot::User>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::User>)data,
             (ptree *)parseJsonAndGetUser,(string *)0x0);
  std::__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x1e0),
             (__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"new_chat_members",&local_71);
  parseJsonAndGetArray<TgBot::User>
            ((vector<std::shared_ptr<TgBot::User>,_std::allocator<std::shared_ptr<TgBot::User>_>_> *
             )&local_40,(TgTypeParser *)data,0x1e326c,(ptree *)0x0,&in_RDX->m_data);
  std::vector<std::shared_ptr<TgBot::User>,_std::allocator<std::shared_ptr<TgBot::User>_>_>::
  _M_move_assign((vector<std::shared_ptr<TgBot::User>,_std::allocator<std::shared_ptr<TgBot::User>_>_>
                  *)(*(long *)this + 0x1f0),&local_40);
  std::vector<std::shared_ptr<TgBot::User>,_std::allocator<std::shared_ptr<TgBot::User>_>_>::~vector
            ((vector<std::shared_ptr<TgBot::User>,_std::allocator<std::shared_ptr<TgBot::User>_>_> *
             )&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"left_chat_participant",&local_71);
  tryParseJson<TgBot::User>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::User>)data,
             (ptree *)parseJsonAndGetUser,(string *)0x0);
  std::__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x208),
             (__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"new_chat_title",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_40,in_RDX,&local_70,"");
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x218),(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"new_chat_photo",&local_71);
  parseJsonAndGetArray<TgBot::PhotoSize>
            ((vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
              *)&local_40,(TgTypeParser *)data,0x1e42d0,(ptree *)0x0,&in_RDX->m_data);
  std::
  vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>::
  _M_move_assign((vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
                  *)(*(long *)this + 0x238),&local_40);
  std::
  vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>::
  ~vector((vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
           *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"delete_chat_photo",0x2e);
  local_40._M_dataplus._M_p = local_40._M_dataplus._M_p & 0xffffffffffffff00;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&local_70,(bool *)&local_40);
  *(type_conflict *)(*(long *)this + 0x250) = tVar1;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"group_chat_created",0x2e);
  local_40._M_dataplus._M_p = local_40._M_dataplus._M_p & 0xffffffffffffff00;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&local_70,(bool *)&local_40);
  *(type_conflict *)(*(long *)this + 0x251) = tVar1;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"caption",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_40,in_RDX,&local_70,"");
  std::__cxx11::string::operator=((string *)(*(long *)this + 400),(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"supergroup_chat_created",0x2e);
  local_40._M_dataplus._M_p = local_40._M_dataplus._M_p & 0xffffffffffffff00;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&local_70,(bool *)&local_40);
  *(type_conflict *)(*(long *)this + 0x252) = tVar1;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"channel_chat_created",0x2e);
  local_40._M_dataplus._M_p = local_40._M_dataplus._M_p & 0xffffffffffffff00;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&local_70,(bool *)&local_40);
  *(type_conflict *)(*(long *)this + 0x253) = tVar1;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"migrate_to_chat_id",0x2e);
  local_40._M_dataplus._M_p = (pointer)0x0;
  tVar4 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<long>(in_RDX,&local_70,(long *)&local_40);
  *(type *)(*(long *)this + 600) = tVar4;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"migrate_from_chat_id",0x2e);
  local_40._M_dataplus._M_p = (pointer)0x0;
  tVar4 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<long>(in_RDX,&local_70,(long *)&local_40);
  *(type *)(*(long *)this + 0x260) = tVar4;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"pinned_message",&local_71);
  tryParseJson<TgBot::Message>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::Message>)data,
             (ptree *)parseJsonAndGetMessage,(string *)0x0);
  std::__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x268),
             (__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"invoice",&local_71);
  tryParseJson<TgBot::Invoice>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::Invoice>)data,
             (ptree *)parseJsonAndGetInvoice,(string *)0x0);
  std::__shared_ptr<TgBot::Invoice,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Invoice,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x278),
             (__shared_ptr<TgBot::Invoice,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"successful_payment",&local_71);
  tryParseJson<TgBot::SuccessfulPayment>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::SuccessfulPayment>)data,
             (ptree *)parseJsonAndGetSuccessfulPayment,(string *)0x0);
  std::__shared_ptr<TgBot::SuccessfulPayment,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::SuccessfulPayment,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)this + 0x288),
             (__shared_ptr<TgBot::SuccessfulPayment,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"connected_website",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_40,in_RDX,&local_70,"");
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x298),(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  PVar5.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar5.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Ptr)PVar5.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Message::Ptr TgTypeParser::parseJsonAndGetMessage(const ptree& data) const {
    auto result(make_shared<Message>());
    result->messageId = data.get<int32_t>("message_id");
    result->from = tryParseJson<User>(&TgTypeParser::parseJsonAndGetUser, data, "from");
    result->date = data.get<int32_t>("date");
    result->chat = parseJsonAndGetChat(data.find("chat")->second);
    result->forwardFrom = tryParseJson<User>(&TgTypeParser::parseJsonAndGetUser, data, "forward_from");
    result->forwardFromChat = tryParseJson<Chat>(&TgTypeParser::parseJsonAndGetChat, data, "forward_from_chat");
    result->forwardFromMessageId = data.get<int32_t>("forward_from_message_id", 0);
    result->forwardSignature = data.get("forward_signature", "");
    result->forwardDate = data.get("forward_date", 0);
    result->replyToMessage = tryParseJson<Message>(&TgTypeParser::parseJsonAndGetMessage, data, "reply_to_message");
    result->editDate = data.get<int32_t>("edit_date", 0);
    result->authorSignature = data.get("author_signature", "");
    result->text = data.get("text", "");
    result->entities = parseJsonAndGetArray<MessageEntity>(&TgTypeParser::parseJsonAndGetMessageEntity, data, "entities");
    result->captionEntities = parseJsonAndGetArray<MessageEntity>(&TgTypeParser::parseJsonAndGetMessageEntity, data, "caption_entities");
    result->audio = tryParseJson<Audio>(&TgTypeParser::parseJsonAndGetAudio, data, "audio");
    result->document = tryParseJson<Document>(&TgTypeParser::parseJsonAndGetDocument, data, "document");
    result->animation = tryParseJson<Animation>(&TgTypeParser::parseJsonAndGetAnimation, data, "animation");
    result->game = tryParseJson<Game>(&TgTypeParser::parseJsonAndGetGame, data, "game");
    result->photo = parseJsonAndGetArray<PhotoSize>(&TgTypeParser::parseJsonAndGetPhotoSize, data, "photo");
    result->sticker = tryParseJson<Sticker>(&TgTypeParser::parseJsonAndGetSticker, data, "sticker");
    result->video = tryParseJson<Video>(&TgTypeParser::parseJsonAndGetVideo, data, "video");
    result->contact = tryParseJson<Contact>(&TgTypeParser::parseJsonAndGetContact, data, "contact");
    result->location = tryParseJson<Location>(&TgTypeParser::parseJsonAndGetLocation, data, "location");
    result->newChatMember = tryParseJson<User>(&TgTypeParser::parseJsonAndGetUser, data, "new_chat_participant");
    result->newChatMembers = parseJsonAndGetArray<User>(&TgTypeParser::parseJsonAndGetUser, data, "new_chat_members");
    result->leftChatMember = tryParseJson<User>(&TgTypeParser::parseJsonAndGetUser, data, "left_chat_participant");
    result->newChatTitle = data.get("new_chat_title", "");
    result->newChatPhoto = parseJsonAndGetArray<PhotoSize>(&TgTypeParser::parseJsonAndGetPhotoSize, data, "new_chat_photo");
    result->deleteChatPhoto = data.get("delete_chat_photo", false);
    result->groupChatCreated = data.get("group_chat_created", false);
    result->caption = data.get("caption", "");
    result->supergroupChatCreated = data.get("supergroup_chat_created", false);
    result->channelChatCreated = data.get("channel_chat_created", false);
    result->migrateToChatId = data.get<int64_t>("migrate_to_chat_id", 0);
    result->migrateFromChatId = data.get<int64_t>("migrate_from_chat_id", 0);
    result->pinnedMessage = tryParseJson<Message>(&TgTypeParser::parseJsonAndGetMessage, data, "pinned_message");
    result->invoice = tryParseJson<Invoice>(&TgTypeParser::parseJsonAndGetInvoice, data, "invoice");
    result->successfulPayment = tryParseJson<SuccessfulPayment>(&TgTypeParser::parseJsonAndGetSuccessfulPayment, data, "successful_payment");
    result->connectedWebsite = data.get("connected_website", "");
    return result;
}